

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteBinaryHeader(FBXExporter *this)

{
  element_type *peVar1;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_70;
  StreamWriterLE outstream;
  char binary_header [24];
  
  builtin_strncpy(binary_header,"Kaydara FBX Binary  ",0x15);
  binary_header[0x15] = '\x1a';
  binary_header[0x16] = '\0';
  binary_header[0x17] = '\0';
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,binary_header,1,0x17);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter
            (&outstream,(shared_ptr<Assimp::IOStream> *)&local_70,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  StreamWriter<false,_false>::Put<unsigned_int>(&outstream,0x1d4c);
  StreamWriter<false,_false>::~StreamWriter(&outstream);
  return;
}

Assistant:

void FBXExporter::WriteBinaryHeader()
{
    // first a specific sequence of 23 bytes, always the same
    const char binary_header[24] = "Kaydara FBX Binary\x20\x20\x00\x1a\x00";
    outfile->Write(binary_header, 1, 23);

    // then FBX version number, "multiplied" by 1000, as little-endian uint32.
    // so 7.3 becomes 7300 == 0x841C0000, 7.4 becomes 7400 == 0xE81C0000, etc
    {
        StreamWriterLE outstream(outfile);
        outstream.PutU4(EXPORT_VERSION_INT);
    } // StreamWriter destructor writes the data to the file

    // after this the node data starts immediately
    // (probably with the FBXHEaderExtension node)
}